

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O3

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::read_message(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
               *this,shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                     *connection,size_t num_additional_bytes)

{
  anon_class_32_3_fcf512cb_for_handler_ local_50;
  basic_streambuf_ref<std::allocator<char>_> local_30;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *local_28;
  transfer_exactly_t local_20;
  
  Connection::set_timeout
            ((connection->
             super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr,-1);
  local_50.connection.
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (connection->
            super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_28 = ((local_50.connection.
               super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->socket)._M_t.
             super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
             .
             super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
             ._M_head_impl;
  local_30.sb_ = (basic_streambuf<std::allocator<char>_> *)
                 &((((local_50.connection.
                      super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->in_message).
                    super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_istream).field_0x20;
  local_20.size_ = 0;
  if (num_additional_bytes < 3) {
    local_20.size_ = 2 - num_additional_bytes;
  }
  local_50.connection.
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (connection->
       super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_50.connection.
      super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.connection.
       super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_50.connection.
            super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.connection.
       super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_50.connection.
            super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_50.this = this;
  local_50.num_additional_bytes = num_additional_bytes;
  asio::detail::
  initiate_async_read_dynbuf_v1<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
  ::operator()((initiate_async_read_dynbuf_v1<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
                *)&local_28,&local_50,&local_30,&local_20);
  if (local_50.connection.
      super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.connection.
               super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void read_message(const std::shared_ptr<Connection> &connection, std::size_t num_additional_bytes) {
      connection->set_timeout();
      asio::async_read(*connection->socket, connection->in_message->streambuf, asio::transfer_exactly(num_additional_bytes > 2 ? 0 : 2 - num_additional_bytes), [this, connection, num_additional_bytes](const error_code &ec, std::size_t bytes_transferred) {
        connection->cancel_timeout();
        auto lock = connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if(!ec) {
          if(bytes_transferred == 0 && connection->in_message->streambuf.size() == 0) { // TODO: This might happen on server at least, might also happen here
            this->read_message(connection, 0);
            return;
          }
          auto updated_num_additional_bytes = num_additional_bytes > 2 ? num_additional_bytes - 2 : 0;

          std::array<unsigned char, 2> first_bytes;
          connection->in_message->read(reinterpret_cast<char *>(&first_bytes[0]), 2);

          connection->in_message->fin_rsv_opcode = first_bytes[0];

          // Close connection if masked message from server (protocol error)
          if(first_bytes[1] >= 128) {
            const std::string reason("message from server masked");
            connection->send_close(1002, reason);
            this->connection_close(connection, 1002, reason);
            return;
          }

          std::size_t length = (first_bytes[1] & 127);

          if(length == 126) {
            // 2 next bytes is the size of content
            connection->set_timeout();
            asio::async_read(*connection->socket, connection->in_message->streambuf, asio::transfer_exactly(updated_num_additional_bytes > 2 ? 0 : 2 - updated_num_additional_bytes), [this, connection, updated_num_additional_bytes](const error_code &ec, std::size_t /*bytes_transferred*/) {
              connection->cancel_timeout();
              auto lock = connection->handler_runner->continue_lock();
              if(!lock)
                return;
              if(!ec) {
                std::array<unsigned char, 2> length_bytes;
                connection->in_message->read(reinterpret_cast<char *>(&length_bytes[0]), 2);

                std::size_t length = 0;
                std::size_t num_bytes = 2;
                for(std::size_t c = 0; c < num_bytes; c++)
                  length += static_cast<std::size_t>(length_bytes[c]) << (8 * (num_bytes - 1 - c));

                connection->in_message->length = length;
                this->read_message_content(connection, updated_num_additional_bytes > 2 ? updated_num_additional_bytes - 2 : 0);
              }
              else
                this->connection_error(connection, ec);
            });
          }
          else if(length == 127) {
            // 8 next bytes is the size of content
            connection->set_timeout();
            asio::async_read(*connection->socket, connection->in_message->streambuf, asio::transfer_exactly(updated_num_additional_bytes > 8 ? 0 : 8 - updated_num_additional_bytes), [this, connection, updated_num_additional_bytes](const error_code &ec, std::size_t /*bytes_transferred*/) {
              connection->cancel_timeout();
              auto lock = connection->handler_runner->continue_lock();
              if(!lock)
                return;
              if(!ec) {
                std::array<unsigned char, 8> length_bytes;
                connection->in_message->read(reinterpret_cast<char *>(&length_bytes[0]), 8);

                std::size_t length = 0;
                std::size_t num_bytes = 8;
                for(std::size_t c = 0; c < num_bytes; c++)
                  length += static_cast<std::size_t>(length_bytes[c]) << (8 * (num_bytes - 1 - c));

                connection->in_message->length = length;
                this->read_message_content(connection, updated_num_additional_bytes > 8 ? updated_num_additional_bytes - 8 : 0);
              }
              else
                this->connection_error(connection, ec);
            });
          }
          else {
            connection->in_message->length = length;
            this->read_message_content(connection, updated_num_additional_bytes);
          }
        }
        else
          this->connection_error(connection, ec);
      });
    }